

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_cmd_ln.c
# Opt level: O1

int32 parse_cmd_ln(int argc,char **argv)

{
  cmd_ln_t *pcVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  undefined8 *puVar5;
  char examplestr [82];
  char helpstr [97];
  undefined8 auStack_d8 [10];
  undefined2 local_88;
  undefined8 local_78 [12];
  undefined1 local_18;
  
  pcVar4 = 
  "Description: \nConvert s3 model definition file and s3 mixture weight file to a s2 senddump file."
  ;
  puVar5 = local_78;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined8 *)pcVar4;
    pcVar4 = pcVar4 + 8;
    puVar5 = puVar5 + 1;
  }
  local_18 = 0;
  pcVar4 = "Example: \n\nmk_s2sendump -moddeffn s3mdef -mixwfn s3mixw -sendumpfn s2dir/sendump\n";
  puVar5 = auStack_d8;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined8 *)pcVar4;
    pcVar4 = pcVar4 + 8;
    puVar5 = puVar5 + 1;
  }
  local_88 = 10;
  cmd_ln_parse(parse_cmd_ln::defn,argc,argv,1);
  pcVar1 = cmd_ln_get();
  lVar3 = cmd_ln_int_r(pcVar1,"-help");
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-example");
  if ((int)lVar3 != 0) {
    printf("%s\n\n",local_78);
  }
  if ((int)lVar2 != 0) {
    printf("%s\n\n",auStack_d8);
  }
  if ((int)lVar2 == 0 && (int)lVar3 == 0) {
    return 0;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/parse_cmd_ln.c"
          ,0x79,"User asked for help or example.\n");
  exit(0);
}

Assistant:

int32 parse_cmd_ln(int argc, char *argv[])
{
  uint32      isHelp;
  uint32      isExample;

  const char helpstr[]=
"Description: \n\
Convert s3 model definition file and s3 mixture weight file to a s2 senddump file.";

  const char examplestr[]=
"Example: \n\
\n\
mk_s2sendump -moddeffn s3mdef -mixwfn s3mixw -sendumpfn s2dir/sendump\n";

    static arg_t defn[] = {
	{ "-help",
	  ARG_BOOLEAN,
	  "no",
	  "Shows the usage of the tool"},

	{ "-example",
	  ARG_BOOLEAN,
	  "no",
	  "Shows example of how to use the tool"},

	{ "-moddeffn",
	      ARG_STRING,
	      NULL,
	      "The model definition file for the model inventory to train" },
	{ "-mixwfn",
	      ARG_STRING,
	      NULL,
	      "The mixture weight parameter file name"},
	{ "-sendumpfn",
	      ARG_STRING,
	      NULL,
	      "Output sendump file name"},
	{ "-pocketsphinx",
	  ARG_BOOLEAN,
	  "no",
	  "Write a PocketSphinx-format senone dump file"},
	{ "-mwfloor",
	  ARG_FLOAT32,
	  "0.00001",
	  "Mixing weight smoothing floor" },

	{ NULL,
	      0,
	      NULL,
	      NULL }
    };

    cmd_ln_parse(defn, argc, argv, TRUE);

    isHelp    = cmd_ln_int32("-help");
    isExample    = cmd_ln_int32("-example");

    if(isHelp){
      printf("%s\n\n",helpstr);
    }

    if(isExample){
      printf("%s\n\n",examplestr);
    }

    if(isHelp || isExample){
      E_INFO("User asked for help or example.\n");
      exit(0);
    }

    return 0;
}